

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvexBuilder.cpp
# Opt level: O1

ChUll * __thiscall ConvexBuilder::canMerge(ConvexBuilder *this,ChUll *a,ChUll *b)

{
  bool bVar1;
  uint uVar2;
  HullError HVar3;
  VertexLookup vc;
  float *pfVar4;
  ChUll *this_00;
  UintVector *indices_00;
  ConvexBuilder *this_01;
  float fVar5;
  HullLibrary hl;
  HullResult hresult;
  UintVector indices;
  HullDesc desc;
  ConvexResult cr;
  HullLibrary local_139;
  HullResult local_138;
  cbtAlignedObjectArray<unsigned_int> local_118;
  HullDesc local_f8;
  ConvexResult local_c8;
  
  indices_00 = (UintVector *)b->mMax;
  this_01 = (ConvexBuilder *)a;
  bVar1 = overlapAABB(a->mMin,a->mMax,b->mMin,(float *)indices_00);
  if (bVar1) {
    vc = Vl_createVertexLookup();
    local_118.m_ownsMemory = true;
    local_118.m_data = (uint *)0x0;
    local_118.m_size = 0;
    local_118.m_capacity = 0;
    getMesh(this_01,a->mResult,vc,indices_00);
    getMesh(this_01,b->mResult,vc,indices_00);
    uVar2 = Vl_getVcount(vc);
    pfVar4 = Vl_getVertices(vc);
    if (local_118.m_size + 2U < 5) {
      Vl_releaseVertexLookup(vc);
      this_00 = (ChUll *)0x0;
    }
    else {
      local_138.mPolygons = true;
      local_138.mNumOutputVertices = 0;
      local_138.mOutputVertices._0_4_ = 0;
      local_138.mOutputVertices._4_4_ = 0;
      local_138.mNumFaces = 0;
      local_138.mNumIndices = 0;
      local_138.mIndices = (uint *)0x0;
      local_f8.mVertexStride = 0xc;
      local_f8.mNormalEpsilon = 0.001;
      local_f8.mSkinWidth = 0.01;
      local_f8.mMaxVertices = 0x1000;
      local_f8.mMaxFaces = 0x1000;
      local_f8.mVcount = uVar2;
      local_f8.mFlags = 1;
      local_f8.mVertices = pfVar4;
      HVar3 = ConvexDecomposition::HullLibrary::CreateConvexHull(&local_139,&local_f8,&local_138);
      if ((HVar3 != QE_OK) ||
         (fVar5 = computeMeshVolume((float *)CONCAT44(local_138.mOutputVertices._4_4_,
                                                      local_138.mOutputVertices._0_4_),
                                    local_138.mNumFaces,local_138.mIndices),
         ((a->mVolume + b->mVolume) * 100.0) / fVar5 < 100.0 - MERGE_PERCENT)) {
        this_00 = (ChUll *)0x0;
      }
      else {
        ConvexDecomposition::ConvexResult::ConvexResult
                  (&local_c8,local_138.mNumOutputVertices,
                   (float *)CONCAT44(local_138.mOutputVertices._4_4_,local_138.mOutputVertices._0_4_
                                    ),local_138.mNumFaces,local_138.mIndices);
        this_00 = (ChUll *)::operator_new(0x28);
        ChUll::ChUll(this_00,&local_c8);
        ConvexDecomposition::ConvexResult::~ConvexResult(&local_c8);
      }
      Vl_releaseVertexLookup(vc);
    }
    cbtAlignedObjectArray<unsigned_int>::~cbtAlignedObjectArray(&local_118);
    return (ChUll *)this_00;
  }
  return (ChUll *)0x0;
}

Assistant:

ChUll * ConvexBuilder::canMerge(ChUll *a,ChUll *b)
{

	if ( !a->overlap(*b) ) return 0; // if their AABB's (with a little slop) don't overlap, then return.

	ChUll *ret = 0;

	// ok..we are going to combine both meshes into a single mesh
	// and then we are going to compute the concavity...

	VertexLookup vc = Vl_createVertexLookup();

	UintVector indices;

	getMesh( *a->mResult, vc, indices );
	getMesh( *b->mResult, vc, indices );

	unsigned int vcount = Vl_getVcount(vc);
	const float *vertices = Vl_getVertices(vc);
	unsigned int tcount = indices.size()/3;
	
	//don't do anything if hull is empty
	if (!tcount)
	{
		Vl_releaseVertexLookup (vc);
		return 0;
	}

	HullResult hresult;
	HullLibrary hl;
	HullDesc   desc;

	desc.SetHullFlag(QF_TRIANGLES);

	desc.mVcount       = vcount;
	desc.mVertices     = vertices;
	desc.mVertexStride = sizeof(float)*3;

	HullError hret = hl.CreateConvexHull(desc,hresult);

	if ( hret == QE_OK )
	{

		float combineVolume  = computeMeshVolume( hresult.mOutputVertices, hresult.mNumFaces, hresult.mIndices );
		float sumVolume      = a->mVolume + b->mVolume;

		float percent = (sumVolume*100) / combineVolume;
		if ( percent >= (100.0f-MERGE_PERCENT) )
		{
			ConvexResult cr(hresult.mNumOutputVertices, hresult.mOutputVertices, hresult.mNumFaces, hresult.mIndices);
			ret = new ChUll(cr);
		}
	}


	Vl_releaseVertexLookup(vc);

	return ret;
}